

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CameraInfo.h
# Opt level: O1

void __thiscall ViconCGStream::VCameraInfo::Write(VCameraInfo *this,VBuffer *i_rBuffer)

{
  uint local_1c;
  uint local_18;
  uint local_14;
  
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_CameraID);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_long_long>
            (&i_rBuffer->m_BufferImpl,&this->m_FramePeriod);
  local_1c = (uint)(this->m_Type)._M_string_length;
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&local_1c);
  ViconCGStreamIO::VBufferImpl::WritePodArray<char>
            (&i_rBuffer->m_BufferImpl,(this->m_Type)._M_dataplus._M_p,
             (uint)(this->m_Type)._M_string_length);
  local_18 = (uint)(this->m_DisplayType)._M_string_length;
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&local_18);
  ViconCGStreamIO::VBufferImpl::WritePodArray<char>
            (&i_rBuffer->m_BufferImpl,(this->m_DisplayType)._M_dataplus._M_p,
             (uint)(this->m_DisplayType)._M_string_length);
  local_14 = (uint)(this->m_Name)._M_string_length;
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&local_14);
  ViconCGStreamIO::VBufferImpl::WritePodArray<char>
            (&i_rBuffer->m_BufferImpl,(this->m_Name)._M_dataplus._M_p,
             (uint)(this->m_Name)._M_string_length);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>
            (&i_rBuffer->m_BufferImpl,&this->m_ResolutionX);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>
            (&i_rBuffer->m_BufferImpl,&this->m_ResolutionY);
  ViconCGStreamIO::VBufferImpl::WritePod<double>(&i_rBuffer->m_BufferImpl,&this->m_AspectRatio);
  ViconCGStreamIO::VBufferImpl::WritePod<double>
            (&i_rBuffer->m_BufferImpl,&this->m_CircularityThreshold);
  ViconCGStreamIO::VBufferImpl::WritePod<bool>(&i_rBuffer->m_BufferImpl,&this->m_bCentroidTracking);
  ViconCGStreamIO::VBufferImpl::WritePod<bool>(&i_rBuffer->m_BufferImpl,&this->m_bIsVideoCamera);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_UserID);
  ViconCGStreamIO::VBufferImpl::WritePod<double>(&i_rBuffer->m_BufferImpl,&this->m_MarkerVelocity);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_CameraID );
    i_rBuffer.Write( m_FramePeriod );
    i_rBuffer.Write( m_Type );
    i_rBuffer.Write( m_DisplayType );
    i_rBuffer.Write( m_Name );
    i_rBuffer.Write( m_ResolutionX );
    i_rBuffer.Write( m_ResolutionY );
    i_rBuffer.Write( m_AspectRatio );
    i_rBuffer.Write( m_CircularityThreshold );
    i_rBuffer.Write( m_bCentroidTracking );
    i_rBuffer.Write( m_bIsVideoCamera );
    i_rBuffer.Write( m_UserID );
    i_rBuffer.Write( m_MarkerVelocity );
  }